

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CDEFFindDirTest_TestSIMDNoMismatch_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::CDEFFindDirTest_TestSIMDNoMismatch_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<int(*)(unsigned_short_const*,int,int*,int),int(*)(unsigned_short_const*,int,int*,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x28);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010393e8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__CDEFFindDirTest_TestSIMDNoMismatch_Test_01039428;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }